

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Platform.cpp
# Opt level: O1

void __thiscall
GmmLib::PlatformInfoGen11::PlatformInfoGen11
          (PlatformInfoGen11 *this,PLATFORM *Platform,Context *pGmmLibContext)

{
  PRODUCT_FAMILY PVar1;
  
  PlatformInfoGen10::PlatformInfoGen10(&this->super_PlatformInfoGen10,Platform,pGmmLibContext);
  (this->super_PlatformInfoGen10).super_PlatformInfo._vptr_PlatformInfo =
       (_func_int **)&PTR__PlatformInfo_001d2608;
  (this->super_PlatformInfoGen10).super_PlatformInfo.Data.SurfaceMaxSize = 0x100000000000;
  (this->super_PlatformInfoGen10).super_PlatformInfo.Data.MaxGpuVirtualAddressBitsPerResource = 0x2c
  ;
  (this->super_PlatformInfoGen10).super_PlatformInfo.Data.ReconMaxHeight = 0x8000;
  PVar1 = (this->super_PlatformInfoGen10).super_PlatformInfo.Data.Platform.eProductFamily;
  if (PVar1 == IGFX_LAKEFIELD) {
    (this->super_PlatformInfoGen10).super_PlatformInfo.Data.SurfaceMaxSize = 0x1000000000;
    (this->super_PlatformInfoGen10).super_PlatformInfo.Data.MaxGpuVirtualAddressBitsPerResource =
         0x24;
  }
  else if (PVar1 == IGFX_ICELAKE) {
    (this->super_PlatformInfoGen10).super_PlatformInfo.Data.TexAlign.CCS.MaxPitchinTiles = 0x400;
  }
  return;
}

Assistant:

GmmLib::PlatformInfoGen11::PlatformInfoGen11(PLATFORM &Platform, Context *pGmmLibContext)
    : PlatformInfoGen10(Platform, pGmmLibContext)
{

    Data.SurfaceMaxSize                      = GMM_GBYTE(16384);
    Data.MaxGpuVirtualAddressBitsPerResource = 44;

    //Override the Height VP9 VdEnc requirement for Gen11 8k resolution.
    Data.ReconMaxHeight = GMM_KBYTE(32);

    //Override CCS MaxPitch requirement
    if(GFX_GET_CURRENT_PRODUCT(Data.Platform) == IGFX_ICELAKE)
    {
        Data.TexAlign.CCS.MaxPitchinTiles = 1024;
    }

    if(GFX_GET_CURRENT_PRODUCT(Data.Platform) == IGFX_LAKEFIELD)
    {
        Data.SurfaceMaxSize                      = GMM_GBYTE(64);
        Data.MaxGpuVirtualAddressBitsPerResource = 36;
    }
}